

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

RK_S32 mpp_dec_push_display(Mpp *mpp,HalDecTaskFlag flags)

{
  MppDec pvVar1;
  MppBufSlots slots;
  MPP_RET MVar2;
  RK_U32 RVar3;
  int local_44;
  HalDecTaskFlag HStack_40;
  RK_S32 ret;
  HalDecTaskFlag tmp;
  RK_U32 eos;
  MppBufSlots frame_slots;
  MppDecImpl *dec;
  Mpp *pMStack_18;
  RK_S32 index;
  Mpp *mpp_local;
  HalDecTaskFlag flags_local;
  
  dec._4_4_ = -1;
  pvVar1 = mpp->mDec;
  slots = *(MppBufSlots *)((long)pvVar1 + 0x30);
  local_44 = 0;
  HStack_40.val = flags.val & 0xfffffffffffffffc;
  pMStack_18 = mpp;
  mpp_local = (Mpp *)flags;
  if (*(long *)((long)pvVar1 + 0x28) != 0) {
    MppThread::lock(*(MppThread **)((long)pvVar1 + 0x28),THREAD_OUTPUT);
  }
  while (MVar2 = mpp_buf_slot_dequeue(slots,(RK_S32 *)((long)&dec + 4),QUEUE_DISPLAY),
        MVar2 == MPP_OK) {
    if (((flags.val & 1) != 0) && (RVar3 = mpp_slots_is_empty(slots,QUEUE_DISPLAY), RVar3 != 0)) {
      HStack_40.val = HStack_40.val & 0xfffffffffffffffe | 1;
    }
    mpp_dec_put_frame(pMStack_18,dec._4_4_,HStack_40);
    mpp_buf_slot_clr_flag(slots,dec._4_4_,SLOT_QUEUE_USE);
    local_44 = local_44 + 1;
  }
  if (*(long *)((long)pvVar1 + 0x28) != 0) {
    MppThread::unlock(*(MppThread **)((long)pvVar1 + 0x28),THREAD_OUTPUT);
  }
  return local_44;
}

Assistant:

RK_S32 mpp_dec_push_display(Mpp *mpp, HalDecTaskFlag flags)
{
    RK_S32 index = -1;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots frame_slots = dec->frame_slots;
    RK_U32 eos = flags.eos;
    HalDecTaskFlag tmp = flags;
    RK_S32 ret = 0;

    tmp.eos = 0;
    /**
     * After info_change is encountered by parser thread, HalDecTaskFlag will
     * have this flag set. Although mpp_dec_flush is called there may be some
     * frames still remaining in display queue and waiting to be output. So
     * these frames shouldn't have info_change set since their resolution and
     * bit depth are the same as before. What's more, the info_change flag has
     * nothing to do with frames being output.
     */
    tmp.info_change = 0;

    if (dec->thread_hal)
        dec->thread_hal->lock(THREAD_OUTPUT);

    while (MPP_OK == mpp_buf_slot_dequeue(frame_slots, &index, QUEUE_DISPLAY)) {
        /* deal with current frame */
        if (eos && mpp_slots_is_empty(frame_slots, QUEUE_DISPLAY))
            tmp.eos = 1;

        mpp_dec_put_frame(mpp, index, tmp);
        mpp_buf_slot_clr_flag(frame_slots, index, SLOT_QUEUE_USE);
        ret++;
    }

    if (dec->thread_hal)
        dec->thread_hal->unlock(THREAD_OUTPUT);

    return ret;
}